

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void handle_left(sockaddr_in addr_from)

{
  sockaddr_in addr_00;
  uchar auVar1 [8];
  uint32_t uVar2;
  Ip_Port IVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  mapped_type local_43c;
  Ip_Port IStack_438;
  int id;
  sockaddr_in sStack_430;
  key_type local_420;
  Ip_Port ip_port;
  sockaddr_in addr;
  char str_addr [1000];
  size_t size_addr;
  sockaddr_in addr_from_local;
  
  uVar2 = ntohl(*(uint32_t *)((long)buf + 8));
  strncpy((char *)addr.sin_zero,(char *)((long)buf + 0xc),(ulong)uVar2);
  IVar3 = addr_from._0_8_;
  auVar1 = addr_from.sin_zero;
  if (addr.sin_zero[0] != '0') {
    addr.sin_zero[uVar2] = '\0';
    parse_address((char *)addr.sin_zero,(sockaddr_in *)&ip_port);
    IVar3 = ip_port;
    auVar1 = (uchar  [8])addr._0_8_;
  }
  addr._0_8_ = auVar1;
  ip_port = IVar3;
  IStack_438 = ip_port;
  sStack_430.sin_family = addr.sin_family;
  sStack_430.sin_port = addr.sin_port;
  sStack_430.sin_addr.s_addr = addr.sin_addr.s_addr;
  addr_00.sin_zero = (uchar  [8])addr._0_8_;
  addr_00._0_8_ = ip_port;
  IVar3 = get_ip_port(addr_00);
  local_420.first = IVar3.first;
  local_420.second = IVar3.second;
  sVar4 = std::
          map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::count(&idconnections,&local_420);
  if (sVar4 == 0) {
    fprintf(_stderr,"Already left\n");
  }
  else {
    pmVar5 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&local_420);
    local_43c = *pmVar5;
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase(&children,&local_43c);
  }
  return;
}

Assistant:

void handle_left(struct sockaddr_in addr_from) {
    size_t size_addr = ntohl(((uint32_t*)buf)[2]);
    char str_addr[ADDRESS_MAX_SIZE];
    strncpy(str_addr, (char*)buf + 3 * sizeof(int), size_addr);

    struct sockaddr_in addr;
    if (str_addr[0] == '0') {
        addr = addr_from;
    }
    else {
        str_addr[size_addr] = '\0';
        parse_address(str_addr, addr);
    }

    Ip_Port ip_port = get_ip_port(addr);
    if (idconnections.count(ip_port)) {
        int id = idconnections[ip_port];
        children.erase(id);
    }
    else {
        fprintf(stderr, "Already left\n");
    }
}